

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *
slack::_detail::json_to_elements
          (vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
           *__return_storage_ptr__,Json *json)

{
  bool bVar1;
  size_type sVar2;
  key_type *pkVar3;
  reference j;
  string local_258 [32];
  string local_238 [32];
  stringstream local_218 [8];
  stringstream ss_value;
  ostream local_208 [376];
  string local_90 [8];
  string label;
  const_iterator local_70;
  undefined1 local_50 [8];
  const_iterator it;
  Json *json_local;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *elements;
  
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::vector
            (__return_storage_ptr__);
  sVar2 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::size(json);
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::reserve
            (__return_storage_ptr__,sVar2 + 1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((const_iterator *)local_50,json);
  while( true ) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::end(&local_70,json);
    bVar1 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_50,&local_70);
    if (!bVar1) break;
    pkVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_50);
    std::__cxx11::string::string(local_90,(string *)pkVar3);
    std::__cxx11::stringstream::stringstream(local_218);
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::value((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_50);
    nlohmann::operator<<(local_208,j);
    std::__cxx11::stringstream::str();
    remove_first_last_quote(local_238);
    std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string>
              ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
               local_238);
    std::__cxx11::string::~string((string *)local_238);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::stringstream::~stringstream(local_218);
    std::__cxx11::string::~string(local_90);
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

inline
auto json_to_elements(const Json& json) -> std::vector<Element> {
    auto elements = std::vector<Element>{};
    elements.reserve(json.size() + 1); // +1 for token
    for (auto it = json.begin(); it != json.end(); ++ it) { 
        std::string label = it.key();
        std::stringstream ss_value;
        ss_value << it.value();
        elements.emplace_back(label, remove_first_last_quote(ss_value.str()));
    }
    return elements;
}